

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int
main()
{
    C c;
    c.mem();
    temp_func<int>(c, &C::mem3);
    temp_func<>(c, &C::mem3);
    (void)static_cast<void(C::*)(int)>(&C::mem3);
    (void)static_cast<void(C::*)(int)>(&C::mem);
    // temp_func<>(c, &C::mem);
    // temp_func<int>(mem_ptr(c, mem));
    // temp_func<>(mem_ptr(c, mem));
    // temp_func(mem_ptr(c, mem2));
    // temp_macro(c, mem, int);
    // temp_macro(c, mem);
    return 0;
}